

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExprExtractNode(jx9_gen_state *pGen,jx9_expr_node **ppNode)

{
  long lVar1;
  sxu32 nKeyID;
  sxi32 sVar2;
  int iVar3;
  ProcNodeConstruct p_Var4;
  sxi32 local_34;
  int nKeyword;
  sxi32 rc;
  SyToken *pCur;
  jx9_expr_node *pNode;
  jx9_expr_node **ppNode_local;
  jx9_gen_state *pGen_local;
  
  pNode = (jx9_expr_node *)ppNode;
  ppNode_local = (jx9_expr_node **)pGen;
  pCur = (SyToken *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x68);
  if (pCur == (SyToken *)0x0) {
    pGen_local._4_4_ = -1;
  }
  else {
    SyZero(pCur,0x68);
    SySetInit((SySet *)&pCur[1].pUserData,(SyMemBackend *)*ppNode_local,8);
    _nKeyword = ppNode_local[0x2b];
    pCur->pUserData = _nKeyword;
    if (((ulong)_nKeyword->pRight & 0x20) == 0) {
      if (((ulong)_nKeyword->pRight & 0x10) == 0) {
        if (((ulong)_nKeyword->pRight & 0x40) == 0) {
          if ((((ulong)_nKeyword->pRight & 0x800) == 0) || (((ulong)_nKeyword->pRight & 0x20) != 0))
          {
            if (((ulong)_nKeyword->pRight & 4) == 0) {
              if (((ulong)_nKeyword->pRight & 8) == 0) {
                if (((ulong)_nKeyword->pRight & 0x1216c0) == 0) {
                  p_Var4 = jx9GetNodeHandler(*(sxu32 *)&_nKeyword->pRight);
                  *(ProcNodeConstruct *)&pCur[1].nType = p_Var4;
                  lVar1._0_4_ = pCur[1].nType;
                  lVar1._4_4_ = pCur[1].nLine;
                  if (lVar1 == 0) {
                    local_34 = jx9GenCompileError((jx9_gen_state *)ppNode_local,1,
                                                  *(sxu32 *)((long)pCur->pUserData + 0x14),
                                                  "Syntax error: Unexpected token \'%z\'",
                                                  pCur->pUserData);
                    if (local_34 != -10) {
                      local_34 = -0xc;
                    }
                    SyMemBackendPoolFree((SyMemBackend *)*ppNode_local,pCur);
                    return local_34;
                  }
                }
              }
              else {
                *(code **)&pCur[1].nType = jx9CompileLiteral;
              }
              _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
            }
            else {
              nKeyID = (sxu32)_nKeyword->pStart;
              if (nKeyID == 6) {
                if (&_nKeyword->pEnd < ppNode_local[0x2c]) {
                  sVar2 = ExprAssembleAnnon((jx9_gen_state *)ppNode_local,(SyToken **)&nKeyword,
                                            (SyToken *)ppNode_local[0x2c]);
                  if (sVar2 != 0) {
                    SyMemBackendPoolFree((SyMemBackend *)*ppNode_local,pCur);
                    return sVar2;
                  }
                  *(code **)&pCur[1].nType = jx9CompileAnnonFunc;
                }
                else {
                  _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
                  *(code **)&pCur[1].nType = jx9CompileLiteral;
                }
              }
              else {
                iVar3 = jx9IsLangConstruct(nKeyID);
                if ((iVar3 == 0) || (ppNode_local[0x2c] <= &_nKeyword->pEnd)) {
                  _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
                  *(code **)&pCur[1].nType = jx9CompileLiteral;
                }
                else {
                  jx9DelimitNestedTokens
                            ((SyToken *)_nKeyword,(SyToken *)ppNode_local[0x2c],0xa40,0x1480,
                             (SyToken **)&nKeyword);
                  *(code **)&pCur[1].nType = jx9CompileLangConstruct;
                }
              }
            }
          }
          else {
            _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
            jx9DelimitNestedTokens
                      ((SyToken *)_nKeyword,(SyToken *)ppNode_local[0x2c],0x800,0x1000,
                       (SyToken **)&nKeyword);
            if (ppNode_local[0x2c] <= _nKeyword) {
              local_34 = jx9GenCompileError((jx9_gen_state *)ppNode_local,1,
                                            *(sxu32 *)((long)pCur->pUserData + 0x14),
                                            "JSON Array: Missing closing square bracket \']\'");
              if (local_34 != -10) {
                local_34 = -0xc;
              }
              SyMemBackendPoolFree((SyMemBackend *)*ppNode_local,pCur);
              return local_34;
            }
            _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
            *(code **)&pCur[1].nType = jx9CompileJsonArray;
          }
        }
        else {
          _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
          jx9DelimitNestedTokens
                    ((SyToken *)_nKeyword,(SyToken *)ppNode_local[0x2c],0x40,0x80,
                     (SyToken **)&nKeyword);
          if (ppNode_local[0x2c] <= _nKeyword) {
            local_34 = jx9GenCompileError((jx9_gen_state *)ppNode_local,1,
                                          *(sxu32 *)((long)pCur->pUserData + 0x14),
                                          "JSON Object: Missing closing braces \'}\'");
            if (local_34 != -10) {
              local_34 = -0xc;
            }
            SyMemBackendPoolFree((SyMemBackend *)*ppNode_local,pCur);
            return local_34;
          }
          _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
          *(code **)&pCur[1].nType = jx9CompileJsonObject;
        }
      }
      else {
        if (ppNode_local[0x2c] <= &_nKeyword->pEnd) {
          _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
          local_34 = jx9GenCompileError((jx9_gen_state *)ppNode_local,1,
                                        *(sxu32 *)((long)pCur->pUserData + 0x14),
                                        "Invalid variable name");
          if (local_34 != -10) {
            local_34 = -0xc;
          }
          SyMemBackendPoolFree((SyMemBackend *)*ppNode_local,pCur);
          return local_34;
        }
        _nKeyword = (jx9_expr_node *)&(_nKeyword->aNodeArgs).pBase;
        *(code **)&pCur[1].nType = jx9CompileVariable;
      }
    }
    else {
      (pCur->sData).zString = (char *)_nKeyword->pStart;
      _nKeyword = (jx9_expr_node *)&_nKeyword->pEnd;
    }
    pCur[1].sData.zString = (char *)_nKeyword;
    pNode->pOp = (jx9_expr_op *)pCur;
    ppNode_local[0x2b] = _nKeyword;
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 ExprExtractNode(jx9_gen_state *pGen, jx9_expr_node **ppNode)
{
	jx9_expr_node *pNode;
	SyToken *pCur;
	sxi32 rc;
	/* Allocate a new node */
	pNode = (jx9_expr_node *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(jx9_expr_node));
	if( pNode == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here.
		 */
		return SXERR_MEM;
	}
	/* Zero the structure */
	SyZero(pNode, sizeof(jx9_expr_node));
	SySetInit(&pNode->aNodeArgs, &pGen->pVm->sAllocator, sizeof(jx9_expr_node **));
	/* Point to the head of the token stream */
	pCur = pNode->pStart = pGen->pIn;
	/* Start collecting tokens */
	if( pCur->nType & JX9_TK_OP ){
		/* Point to the instance that describe this operator */
		pNode->pOp = (const jx9_expr_op *)pCur->pUserData;
		/* Advance the stream cursor */
		pCur++;
	}else if( pCur->nType & JX9_TK_DOLLAR ){
		/* Isolate variable */
		pCur++; /* Jump the dollar sign */
		if( pCur >= pGen->pEnd ){
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine,"Invalid variable name");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
			return rc;
		}
		pCur++; /* Jump the variable name */
		pNode->xCode = jx9CompileVariable;
	}else if( pCur->nType & JX9_TK_OCB /* '{' */ ){
		/* JSON Object, assemble tokens */
		pCur++;
		jx9DelimitNestedTokens(pCur, pGen->pEnd, JX9_TK_OCB /* '[' */, JX9_TK_CCB /* ']' */, &pCur);
		if( pCur < pGen->pEnd ){
			pCur++;
		}else{
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine,"JSON Object: Missing closing braces '}'");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
			return rc;
		}
		pNode->xCode = jx9CompileJsonObject;
	}else if( pCur->nType & JX9_TK_OSB /* '[' */ && !(pCur->nType & JX9_TK_OP) ){
		/* JSON Array, assemble tokens */
		pCur++;
		jx9DelimitNestedTokens(pCur, pGen->pEnd, JX9_TK_OSB /* '[' */, JX9_TK_CSB /* ']' */, &pCur);
		if( pCur < pGen->pEnd ){
			pCur++;
		}else{
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine,"JSON Array: Missing closing square bracket ']'");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
			return rc;
		}
		pNode->xCode = jx9CompileJsonArray;
	}else if( pCur->nType & JX9_TK_KEYWORD ){
		 int nKeyword = SX_PTR_TO_INT(pCur->pUserData);
		 if( nKeyword == JX9_TKWRD_FUNCTION ){
			 /* Annonymous function */
			  if( &pCur[1] >= pGen->pEnd ){
				 /* Assume a literal */
				pCur++;
				pNode->xCode = jx9CompileLiteral;
			 }else{
				 /* Assemble annonymous functions body */
				 rc = ExprAssembleAnnon(&(*pGen), &pCur, pGen->pEnd);
				 if( rc != SXRET_OK ){
					 SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
					 return rc; 
				 }
				 pNode->xCode = jx9CompileAnnonFunc;
			  }
		 }else if( jx9IsLangConstruct(nKeyword) && &pCur[1] < pGen->pEnd ){
			 /* Language constructs [i.e: print,die...] require special handling */
			 jx9DelimitNestedTokens(pCur, pGen->pEnd, JX9_TK_LPAREN|JX9_TK_OCB|JX9_TK_OSB, JX9_TK_RPAREN|JX9_TK_CCB|JX9_TK_CSB, &pCur);
			 pNode->xCode = jx9CompileLangConstruct;
		 }else{
			 /* Assume a literal */
			 pCur++;
			 pNode->xCode = jx9CompileLiteral;
		 }
	 }else if( pCur->nType & (JX9_TK_ID) ){
		 /* Constants, function name, namespace path, object name... */
		 pCur++;
		 pNode->xCode = jx9CompileLiteral;
	 }else{
		 if( (pCur->nType & (JX9_TK_LPAREN|JX9_TK_RPAREN|JX9_TK_COMMA|JX9_TK_CSB|JX9_TK_OCB|JX9_TK_CCB|JX9_TK_COLON)) == 0 ){
			 /* Point to the code generator routine */
			 pNode->xCode = jx9GetNodeHandler(pCur->nType);
			 if( pNode->xCode == 0 ){
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Syntax error: Unexpected token '%z'", &pNode->pStart->sData);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
				 return rc;
			 }
		 }
		/* Advance the stream cursor */
		pCur++;
	 }
	/* Point to the end of the token stream */
	pNode->pEnd = pCur;
	/* Save the node for later processing */
	*ppNode = pNode;
	/* Synchronize cursors */
	pGen->pIn = pCur;
	return SXRET_OK;
}